

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O0

void usage(void)

{
  fprintf(_stderr,"rdjpgcom displays any textual comments in a JPEG file.\n");
  fprintf(_stderr,"Usage: %s [switches] [inputfile]\n",progname);
  fprintf(_stderr,"Switches (names may be abbreviated):\n");
  fprintf(_stderr,"  -raw        Display non-printable characters in comments (unsafe)\n");
  fprintf(_stderr,"  -verbose    Also display dimensions of JPEG image\n");
  exit(1);
}

Assistant:

static void
usage(void)
/* complain about bad command line */
{
  fprintf(stderr, "rdjpgcom displays any textual comments in a JPEG file.\n");

  fprintf(stderr, "Usage: %s [switches] [inputfile]\n", progname);

  fprintf(stderr, "Switches (names may be abbreviated):\n");
  fprintf(stderr, "  -raw        Display non-printable characters in comments (unsafe)\n");
  fprintf(stderr, "  -verbose    Also display dimensions of JPEG image\n");

  exit(EXIT_FAILURE);
}